

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeThrowRef(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  ThrowRef *pTVar2;
  HeapType local_38;
  Type local_30;
  Expression *local_28;
  Expression *ref;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  ref._4_4_ = 1;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&ref + 4));
  if (!bVar1) {
    __assert_fail("type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1458,"Expression *wasm::TranslateToFuzzReader::makeThrowRef(Type)");
  }
  HeapType::HeapType(&local_38,exn);
  Type::Type(&local_30,local_38,Nullable,Inexact);
  local_28 = make(this,local_30);
  pTVar2 = Builder::makeThrowRef(&this->builder,local_28);
  return (Expression *)pTVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeThrowRef(Type type) {
  assert(type == Type::unreachable);
  // Use a nullable type here to avoid the risk of trapping (when we find no way
  // to make a non-nullable ref, we end up fixing validation with
  // ref.as_non_null of a null, which validates but traps).
  auto* ref = make(Type(HeapType::exn, Nullable));
  return builder.makeThrowRef(ref);
}